

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnionDatatypeValidator.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::UnionDatatypeValidator::UnionDatatypeValidator
          (UnionDatatypeValidator *this,DatatypeValidator *baseValidator,
          RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *facets,
          RefArrayVectorOf<char16_t> *enums,int finalSet,MemoryManager *manager,
          RefVectorOf<xercesc_4_0::DatatypeValidator> *memberTypeValidators,
          bool memberTypesInherited)

{
  InvalidDatatypeFacetException *pIVar1;
  CleanupType_conflict20 cleanup;
  JanitorMemFunCall<xercesc_4_0::UnionDatatypeValidator> local_b8 [5];
  
  DatatypeValidator::DatatypeValidator
            (&this->super_DatatypeValidator,baseValidator,facets,finalSet,Union,manager);
  (this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable =
       (_func_int **)&PTR__UnionDatatypeValidator_0040dc68;
  this->fEnumerationInherited = false;
  this->fMemberTypesInherited = memberTypesInherited;
  this->fEnumeration = (RefArrayVectorOf<char16_t> *)0x0;
  this->fMemberTypeValidators = memberTypeValidators;
  if (baseValidator == (DatatypeValidator *)0x0) {
    pIVar1 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
    InvalidDatatypeFacetException::InvalidDatatypeFacetException
              (pIVar1,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/UnionDatatypeValidator.cpp"
               ,0x62,FACET_Union_Null_baseValidator,manager);
    __cxa_throw(pIVar1,&InvalidDatatypeFacetException::typeinfo,XMLException::~XMLException);
  }
  if (baseValidator->fType == Union) {
    local_b8[0].fToCall = (MFPT)cleanUp;
    local_b8[0]._16_8_ = 0;
    local_b8[0].fObject = this;
    init(this,(EVP_PKEY_CTX *)baseValidator);
    local_b8[0].fObject = (UnionDatatypeValidator *)0x0;
    JanitorMemFunCall<xercesc_4_0::UnionDatatypeValidator>::~JanitorMemFunCall(local_b8);
    return;
  }
  XMLString::binToText(baseValidator->fType,(XMLCh *)local_b8,0x40,10,manager);
  pIVar1 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
  InvalidDatatypeFacetException::InvalidDatatypeFacetException
            (pIVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/UnionDatatypeValidator.cpp"
             ,0x6c,FACET_Union_invalid_baseValidatorType,(XMLCh *)local_b8,(XMLCh *)0x0,(XMLCh *)0x0
             ,(XMLCh *)0x0,manager);
  __cxa_throw(pIVar1,&InvalidDatatypeFacetException::typeinfo,XMLException::~XMLException);
}

Assistant:

UnionDatatypeValidator::UnionDatatypeValidator(
                          DatatypeValidator*            const baseValidator
                        , RefHashTableOf<KVStringPair>* const facets
                        , RefArrayVectorOf<XMLCh>*      const enums
                        , const int                           finalSet
                        , MemoryManager* const                manager
                        , RefVectorOf<DatatypeValidator>* const memberTypeValidators 
                        , const bool memberTypesInherited
                        )
:DatatypeValidator(baseValidator, facets, finalSet, DatatypeValidator::Union, manager)
,fEnumerationInherited(false)
,fMemberTypesInherited(memberTypesInherited)
,fEnumeration(0)
,fMemberTypeValidators(memberTypeValidators)
{
    //
    // baseValidator another UnionDTV from which,
    // this UnionDTV is derived by restriction.
    // it shall be not null
    //
    if (!baseValidator)
    {
        ThrowXMLwithMemMgr(InvalidDatatypeFacetException
               , XMLExcepts::FACET_Union_Null_baseValidator, manager);
    }

    if (baseValidator->getType() != DatatypeValidator::Union)
    {
        XMLCh value1[BUF_LEN+1];
        XMLString::binToText(baseValidator->getType(), value1, BUF_LEN, 10, manager);
        ThrowXMLwithMemMgr1(InvalidDatatypeFacetException
                , XMLExcepts::FACET_Union_invalid_baseValidatorType
                , value1
                , manager);
    }

    CleanupType cleanup(this, &UnionDatatypeValidator::cleanUp);

    try
    {
        init(baseValidator, facets, enums, manager);
    }
    catch(const OutOfMemoryException&)
    {
        // Don't cleanup when out of memory, since executing the
        // code can cause problems.
        cleanup.release();

        throw;
    }

    cleanup.release();
}